

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_amount.cpp
# Opt level: O3

Amount cfd::core::operator/(Amount *amount,int64_t value)

{
  int64_t amount_00;
  undefined8 unaff_RBP;
  double dVar1;
  Amount AVar2;
  Amount local_30;
  
  amount_00 = amount->amount_;
  Amount::CheckValidAmount(0x1b25b8);
  Amount::Amount(&local_30,amount_00);
  dVar1 = round((double)local_30.amount_ / (double)value);
  Amount::CheckValidAmount(0x1b25ec);
  AVar2._8_8_ = CONCAT71((int7)((ulong)unaff_RBP >> 8),local_30.ignore_check_) & 0xffffffff;
  AVar2.amount_ = (long)dVar1;
  return AVar2;
}

Assistant:

Amount operator/(const Amount& amount, const int64_t value) {
  return Amount::CreateBySatoshiAmount(amount.GetSatoshiValue()) /= value;
}